

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsExecuteBackgroundParse_Experimental
          (DWORD dwBgParseCookie,JsValueRef script,JsSourceContext sourceContext,WCHAR *url,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,JsValueRef *result)

{
  HRESULT HVar1;
  JsErrorCode JVar2;
  BGParseManager *this;
  WCHAR *local_40;
  WCHAR *url_local;
  
  local_40 = url;
  url_local = (WCHAR *)parserState;
  this = BGParseManager::GetBGParseManager();
  HVar1 = BGParseManager::GetInputFromCookie
                    (this,dwBgParseCookie,(LPCUTF8 *)0x0,(size_t *)0x0,&local_40);
  JVar2 = JsErrorFatal;
  if (HVar1 == 0) {
    JVar2 = RunScriptWithParserStateCore
                      (dwBgParseCookie,script,sourceContext,local_40,parseAttributes,url_local,false
                       ,result);
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsExecuteBackgroundParse_Experimental(
    _In_ DWORD dwBgParseCookie,
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ WCHAR *url,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _Out_ JsValueRef *result)
{
    HRESULT hr = BGParseManager::GetBGParseManager()->GetInputFromCookie(dwBgParseCookie, nullptr, nullptr, &url);
    if (hr == S_OK)
    {
        return RunScriptWithParserStateCore(
            dwBgParseCookie,
            script,
            sourceContext,
            url,
            parseAttributes,
            parserState,
            false,
            result
        );
    }
    else
    {
        return JsErrorFatal;
    }
}